

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCMapping.c
# Opt level: O0

char * PPC_insn_name(csh handle,uint id)

{
  bool bVar1;
  uint i;
  uint id_local;
  csh handle_local;
  char *local_8;
  
  if (id < 0x456) {
    bVar1 = false;
    while (!bVar1) {
      if (id == 0) {
        return (char *)0x0;
      }
      bVar1 = true;
    }
    local_8 = insn_name_maps[id].name;
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char *PPC_insn_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	unsigned int i;

	if (id >= PPC_INS_ENDING)
		return NULL;

	// handle special alias first
	for (i = 0; i < ARR_SIZE(alias_insn_names); i++) {
		if (alias_insn_names[i].id == id)
			return alias_insn_names[i].name;
	}

	return insn_name_maps[id].name;
#else
	return NULL;
#endif
}